

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemengine_unix.cpp
# Opt level: O2

int QFileSystemEngine::rmdir(char *__path)

{
  bool bVar1;
  int iVar2;
  int *piVar3;
  char *__path_00;
  long in_FS_OFFSET;
  QArrayDataPointer<char> local_28;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_28.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_28.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_28.ptr = &DAT_aaaaaaaaaaaaaaaa;
  QFileSystemEntry::nativeFilePath((NativePath *)&local_28,(QFileSystemEntry *)__path);
  if ((undefined1 *)local_28.size != (undefined1 *)0x0) {
    bVar1 = qIsFilenameBroken((QByteArray *)&local_28);
    if (!bVar1) {
      __path_00 = local_28.ptr;
      if (local_28.ptr == (char *)0x0) {
        __path_00 = "";
      }
      iVar2 = ::rmdir(__path_00);
      iVar2 = (int)CONCAT71((int7)((ulong)&local_28 >> 8),iVar2 == 0);
      goto LAB_00124623;
    }
  }
  piVar3 = __errno_location();
  *piVar3 = 0x16;
  iVar2 = 0;
LAB_00124623:
  QArrayDataPointer<char>::~QArrayDataPointer(&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return iVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QFileSystemEngine::rmdir(const QFileSystemEntry &entry)
{
    const QByteArray path = entry.nativeFilePath();
    Q_CHECK_FILE_NAME(path, false);
    return ::rmdir(path.constData()) == 0;
}